

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cc
# Opt level: O2

void __thiscall avro::MemoryOutputStream::~MemoryOutputStream(MemoryOutputStream *this)

{
  pointer ppuVar1;
  
  (this->super_OutputStream)._vptr_OutputStream = (_func_int **)&PTR__MemoryOutputStream_001ebea0;
  for (ppuVar1 = (this->data_).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppuVar1 !=
      (this->data_).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppuVar1 = ppuVar1 + 1) {
    if (*ppuVar1 != (uchar *)0x0) {
      operator_delete__(*ppuVar1);
    }
  }
  std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
            (&(this->data_).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>);
  return;
}

Assistant:

~MemoryOutputStream() {
        for (std::vector<uint8_t*>::const_iterator it = data_.begin();
            it != data_.end(); ++it) {
            delete[] *it;
        }
    }